

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int combine_inputs(wally_psbt_input *dst,wally_psbt_input *src)

{
  uchar *puVar1;
  int local_24;
  int ret;
  wally_psbt_input *src_local;
  wally_psbt_input *dst_local;
  
  dst_local._4_4_ = combine_txs(&dst->utxo,src->utxo);
  if ((dst_local._4_4_ == 0) &&
     (((local_24 = 0, dst->witness_utxo != (wally_tx_output *)0x0 ||
       (src->witness_utxo == (wally_tx_output *)0x0)) ||
      (local_24 = wally_tx_output_clone_alloc(src->witness_utxo,&dst->witness_utxo),
      dst_local._4_4_ = local_24, local_24 == 0)))) {
    if ((dst->redeem_script == (uchar *)0x0) && (src->redeem_script != (uchar *)0x0)) {
      if ((src->redeem_script == (uchar *)0x0) || (src->redeem_script_len != 0)) {
        local_24 = wally_psbt_input_set_redeem_script(dst,src->redeem_script,src->redeem_script_len)
        ;
      }
      else {
        puVar1 = (uchar *)wally_malloc(1);
        dst->redeem_script = puVar1;
        if (puVar1 == (uchar *)0x0) {
          local_24 = -3;
        }
      }
      if (local_24 != 0) {
        return local_24;
      }
    }
    if ((dst->witness_script == (uchar *)0x0) && (src->witness_script != (uchar *)0x0)) {
      if ((src->witness_script == (uchar *)0x0) || (src->witness_script_len != 0)) {
        local_24 = wally_psbt_input_set_witness_script
                             (dst,src->witness_script,src->witness_script_len);
      }
      else {
        puVar1 = (uchar *)wally_malloc(1);
        dst->witness_script = puVar1;
        if (puVar1 == (uchar *)0x0) {
          local_24 = -3;
        }
      }
      if (local_24 != 0) {
        return local_24;
      }
    }
    if ((dst->final_scriptsig == (uchar *)0x0) && (src->final_scriptsig != (uchar *)0x0)) {
      if ((src->final_scriptsig == (uchar *)0x0) || (src->final_scriptsig_len != 0)) {
        local_24 = wally_psbt_input_set_final_scriptsig
                             (dst,src->final_scriptsig,src->final_scriptsig_len);
      }
      else {
        puVar1 = (uchar *)wally_malloc(1);
        dst->final_scriptsig = puVar1;
        if (puVar1 == (uchar *)0x0) {
          local_24 = -3;
        }
      }
      if (local_24 != 0) {
        return local_24;
      }
    }
    if (((((dst->final_witness != (wally_tx_witness_stack *)0x0) ||
          (src->final_witness == (wally_tx_witness_stack *)0x0)) ||
         (dst_local._4_4_ = wally_psbt_input_set_final_witness(dst,src->final_witness),
         dst_local._4_4_ == 0)) &&
        ((dst_local._4_4_ = map_extend(&dst->keypaths,&src->keypaths,wally_ec_public_key_verify),
         dst_local._4_4_ == 0 &&
         (dst_local._4_4_ = map_extend(&dst->signatures,&src->signatures,wally_ec_public_key_verify)
         , dst_local._4_4_ == 0)))) &&
       (dst_local._4_4_ =
             map_extend(&dst->unknowns,&src->unknowns,(_func_int_uchar_ptr_size_t *)0x0),
       dst_local._4_4_ == 0)) {
      if ((dst->sighash == 0) && (src->sighash != 0)) {
        dst->sighash = src->sighash;
      }
      if ((dst->has_value == 0) && (src->has_value != 0)) {
        dst->value = src->value;
        dst->has_value = 1;
      }
      local_24 = 0;
      if ((dst->vbf == (uchar *)0x0) && (src->vbf != (uchar *)0x0)) {
        if ((src->vbf == (uchar *)0x0) || (src->vbf_len != 0)) {
          local_24 = wally_psbt_input_set_vbf(dst,src->vbf,src->vbf_len);
        }
        else {
          puVar1 = (uchar *)wally_malloc(1);
          dst->vbf = puVar1;
          if (puVar1 == (uchar *)0x0) {
            local_24 = -3;
          }
        }
        if (local_24 != 0) {
          return local_24;
        }
      }
      if ((dst->asset == (uchar *)0x0) && (src->asset != (uchar *)0x0)) {
        if ((src->asset == (uchar *)0x0) || (src->asset_len != 0)) {
          local_24 = wally_psbt_input_set_asset(dst,src->asset,src->asset_len);
        }
        else {
          puVar1 = (uchar *)wally_malloc(1);
          dst->asset = puVar1;
          if (puVar1 == (uchar *)0x0) {
            local_24 = -3;
          }
        }
        if (local_24 != 0) {
          return local_24;
        }
      }
      if ((dst->abf == (uchar *)0x0) && (src->abf != (uchar *)0x0)) {
        if ((src->abf == (uchar *)0x0) || (src->abf_len != 0)) {
          local_24 = wally_psbt_input_set_abf(dst,src->abf,src->abf_len);
        }
        else {
          puVar1 = (uchar *)wally_malloc(1);
          dst->abf = puVar1;
          if (puVar1 == (uchar *)0x0) {
            local_24 = -3;
          }
        }
        if (local_24 != 0) {
          return local_24;
        }
      }
      dst_local._4_4_ = combine_txs(&dst->pegin_tx,src->pegin_tx);
      if (dst_local._4_4_ == 0) {
        local_24 = 0;
        if ((dst->txoutproof == (uchar *)0x0) && (src->txoutproof != (uchar *)0x0)) {
          if ((src->txoutproof == (uchar *)0x0) || (src->txoutproof_len != 0)) {
            local_24 = wally_psbt_input_set_txoutproof(dst,src->txoutproof,src->txoutproof_len);
          }
          else {
            puVar1 = (uchar *)wally_malloc(1);
            dst->txoutproof = puVar1;
            if (puVar1 == (uchar *)0x0) {
              local_24 = -3;
            }
          }
          if (local_24 != 0) {
            return local_24;
          }
        }
        if ((dst->genesis_blockhash == (uchar *)0x0) && (src->genesis_blockhash != (uchar *)0x0)) {
          if ((src->genesis_blockhash == (uchar *)0x0) || (src->genesis_blockhash_len != 0)) {
            local_24 = wally_psbt_input_set_genesis_blockhash
                                 (dst,src->genesis_blockhash,src->genesis_blockhash_len);
          }
          else {
            puVar1 = (uchar *)wally_malloc(1);
            dst->genesis_blockhash = puVar1;
            if (puVar1 == (uchar *)0x0) {
              local_24 = -3;
            }
          }
          if (local_24 != 0) {
            return local_24;
          }
        }
        if ((dst->claim_script == (uchar *)0x0) && (src->claim_script != (uchar *)0x0)) {
          if ((src->claim_script == (uchar *)0x0) || (src->claim_script_len != 0)) {
            local_24 = wally_psbt_input_set_claim_script
                                 (dst,src->claim_script,src->claim_script_len);
          }
          else {
            puVar1 = (uchar *)wally_malloc(1);
            dst->claim_script = puVar1;
            if (puVar1 == (uchar *)0x0) {
              local_24 = -3;
            }
          }
          if (local_24 != 0) {
            return local_24;
          }
        }
        dst_local._4_4_ = 0;
      }
    }
  }
  return dst_local._4_4_;
}

Assistant:

static int combine_inputs(struct wally_psbt_input *dst,
                          const struct wally_psbt_input *src)
{
    int ret;

    if ((ret = combine_txs(&dst->utxo, src->utxo)) != WALLY_OK)
        return ret;

    if (!dst->witness_utxo && src->witness_utxo) {
        ret = wally_tx_output_clone_alloc(src->witness_utxo, &dst->witness_utxo);
        if (ret != WALLY_OK)
            return ret;
    }

    COMBINE_BYTES(input, redeem_script);
    COMBINE_BYTES(input, witness_script);
    COMBINE_BYTES(input, final_scriptsig);

    if (!dst->final_witness && src->final_witness &&
        (ret = wally_psbt_input_set_final_witness(dst, src->final_witness)) != WALLY_OK)
        return ret;
    if ((ret = map_extend(&dst->keypaths, &src->keypaths, wally_ec_public_key_verify)) != WALLY_OK)
        return ret;
    if ((ret = map_extend(&dst->signatures, &src->signatures, wally_ec_public_key_verify)) != WALLY_OK)
        return ret;
    if ((ret = map_extend(&dst->unknowns, &src->unknowns, NULL)) != WALLY_OK)
        return ret;
    if (!dst->sighash && src->sighash)
        dst->sighash = src->sighash;

#ifdef BUILD_ELEMENTS
    if (!dst->has_value && src->has_value) {
        dst->value = src->value;
        dst->has_value = true;
    }
    COMBINE_BYTES(input, vbf);
    COMBINE_BYTES(input, asset);
    COMBINE_BYTES(input, abf);
    if ((ret = combine_txs(&dst->pegin_tx, src->pegin_tx)) != WALLY_OK)
        return ret;
    COMBINE_BYTES(input, txoutproof);
    COMBINE_BYTES(input, genesis_blockhash);
    COMBINE_BYTES(input, claim_script);
#endif
    return WALLY_OK;
}